

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_last.c
# Opt level: O1

int mpt_path_last(mpt_path *path)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  
  uVar6 = path->len;
  if ((uVar6 != 0) && (pcVar2 = path->base, pcVar2 != (char *)0x0)) {
    if (-1 < (char)path->flags) {
      uVar6 = uVar6 - 1;
      uVar8 = uVar6;
      if (uVar6 == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = 0;
        do {
          if (pcVar2[uVar8 - 1] == path->sep) goto LAB_0010dfd4;
          uVar4 = uVar4 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
        uVar4 = uVar6;
        uVar8 = 0;
      }
LAB_0010dfd4:
      iVar3 = (int)uVar4;
      path->off = path->off + uVar8;
      path->first = (uint8_t)uVar4;
      sVar7 = (uVar4 & 0xff) + 1;
LAB_0010dfe1:
      path->len = sVar7;
      return iVar3;
    }
    if (uVar6 != 1) {
      bVar1 = pcVar2[uVar6 - 2];
      if ((ulong)(long)(char)bVar1 <= uVar6) {
        iVar3 = (int)(char)bVar1;
        path->off = path->off + (uVar6 - (long)(char)bVar1);
        path->first = bVar1;
        sVar7 = (ulong)bVar1 + 2;
        goto LAB_0010dfe1;
      }
    }
  }
  piVar5 = __errno_location();
  *piVar5 = 0x16;
  return -2;
}

Assistant:

extern int mpt_path_last(MPT_STRUCT(path) *path)
{
	const char *data;
	size_t len, pos;
	
	if (!(pos = path->len) || !(data = path->base)) {
		errno = EINVAL; return -2;
	}
	if (path->flags & MPT_PATHFLAG(SepBinary)) {
		if (pos < 2 || pos < (len = data[pos-2])) {
			errno = EINVAL; return -2;
		}
		pos -= len;
		
		path->off += pos;
		path->len  = (path->first = len) + 2;
		
		return len;
	}
	
	data += (--pos - 1);
	len = 0;
	
	/* find last separator */
	while (pos && *data != path->sep) {
		--data; ++len; --pos;
	}
	path->off += pos;
	path->len  = (path->first = len) + 1;
	
	return len;
}